

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthPrintProfile(uint *pTruth,int nVars)

{
  uint uTruth [2];
  uint local_8;
  uint local_4;
  
  if (5 < nVars) {
    Kit_TruthPrintProfile_int(pTruth,nVars);
    return;
  }
  if (1 < nVars) {
    _local_8 = CONCAT44(*pTruth,*pTruth);
    Kit_TruthPrintProfile_int(&local_8,6);
    return;
  }
  __assert_fail("nVars >= 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitTruth.c"
                ,0x8a3,"void Kit_TruthPrintProfile(unsigned int *, int)");
}

Assistant:

void Kit_TruthPrintProfile( unsigned * pTruth, int nVars )
{
    unsigned uTruth[2];
    if ( nVars >= 6 )
    {
        Kit_TruthPrintProfile_int( pTruth, nVars );
        return;
    }
    assert( nVars >= 2 );
    uTruth[0] = pTruth[0];
    uTruth[1] = pTruth[0];
    Kit_TruthPrintProfile( uTruth, 6 );
}